

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_huge_repeat(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_timer_t *loop;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_timer_t uStack_b0;
  uv_loop_t *puStack_18;
  code *pcStack_10;
  
  pcStack_10 = (code *)0x174f7b;
  loop = (uv_timer_t *)uv_default_loop();
  pcStack_10 = (code *)0x174f8a;
  iVar1 = uv_timer_init((uv_loop_t *)loop,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_10 = (code *)0x174f97;
    loop = (uv_timer_t *)uv_default_loop();
    pcStack_10 = (code *)0x174fa6;
    iVar1 = uv_timer_init((uv_loop_t *)loop,&huge_timer1);
    if (iVar1 != 0) goto LAB_00175042;
    loop = &tiny_timer;
    pcStack_10 = (code *)0x174fcb;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    if (iVar1 != 0) goto LAB_00175047;
    loop = &huge_timer1;
    pcStack_10 = (code *)0x174fee;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_0017504c;
    pcStack_10 = (code *)0x174ff7;
    loop = (uv_timer_t *)uv_default_loop();
    pcStack_10 = (code *)0x175001;
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00175051;
    pcStack_10 = (code *)0x17500a;
    unaff_RBX = uv_default_loop();
    pcStack_10 = (code *)0x17501e;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_10 = (code *)0x175028;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_10 = (code *)0x17502d;
    loop = (uv_timer_t *)uv_default_loop();
    pcStack_10 = (code *)0x175035;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_10 = (code *)0x175042;
    run_test_timer_huge_repeat_cold_1();
LAB_00175042:
    pcStack_10 = (code *)0x175047;
    run_test_timer_huge_repeat_cold_2();
LAB_00175047:
    pcStack_10 = (code *)0x17504c;
    run_test_timer_huge_repeat_cold_3();
LAB_0017504c:
    pcStack_10 = (code *)0x175051;
    run_test_timer_huge_repeat_cold_4();
LAB_00175051:
    pcStack_10 = (code *)0x175056;
    run_test_timer_huge_repeat_cold_5();
  }
  pcStack_10 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  if (huge_repeat_cb::ncalls == 0) {
    if (loop == &huge_timer1) {
      huge_repeat_cb::ncalls = 1;
      return extraout_EAX;
    }
  }
  else {
    if (loop == &tiny_timer) {
      huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
      if (huge_repeat_cb::ncalls != 10) {
        return extraout_EAX;
      }
      puStack_18 = (uv_loop_t *)0x17508d;
      uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
      return extraout_EAX_00;
    }
    puStack_18 = (uv_loop_t *)0x1750b9;
    huge_repeat_cb_cold_1();
  }
  puStack_18 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_18 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&uStack_b0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_b0,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001751cd;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001751d2;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001751d7;
    iVar1 = uv_timer_start(&uStack_b0,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001751dc;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001751e1;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001751e6;
    uv_close((uv_handle_t *)&uStack_b0,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001751f0;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001751cd:
    run_test_timer_run_once_cold_2();
LAB_001751d2:
    run_test_timer_run_once_cold_3();
LAB_001751d7:
    run_test_timer_run_once_cold_4();
LAB_001751dc:
    run_test_timer_run_once_cold_5();
LAB_001751e1:
    run_test_timer_run_once_cold_6();
LAB_001751e6:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001751f0:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(timer_huge_repeat) {
  ASSERT(0 == uv_timer_init(uv_default_loop(), &tiny_timer));
  ASSERT(0 == uv_timer_init(uv_default_loop(), &huge_timer1));
  ASSERT(0 == uv_timer_start(&tiny_timer, huge_repeat_cb, 2, 2));
  ASSERT(0 == uv_timer_start(&huge_timer1, huge_repeat_cb, 1, (uint64_t) -1));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY();
  return 0;
}